

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFDebugLine::getOrParseLineTable
          (DWARFDebugLine *this,DWARFDataExtractor *DebugLineData,uint64_t Offset,DWARFContext *Ctx,
          DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  function<void_(llvm::Error)> *RecoverableErrorCallback_00;
  DWARFUnit *U_00;
  uint64_t OffsetPtr;
  bool bVar1;
  pointer ppVar2;
  LineTable *DebugLineData_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_bool>
  pVar4;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar5;
  error_code EC;
  function<void_(llvm::Error)> *in_stack_00000008;
  Error local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [8];
  Error Err;
  LineTable *LT;
  LineTable local_1c8;
  pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable> local_120;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_> local_70;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_bool>
  Pos;
  error_code local_50;
  Error local_40;
  function<void_(llvm::Error)> *local_38;
  DWARFUnit *U_local;
  DWARFContext *Ctx_local;
  uint64_t Offset_local;
  DWARFDataExtractor *DebugLineData_local;
  DWARFDebugLine *this_local;
  
  local_38 = RecoverableErrorCallback;
  U_local = U;
  Ctx_local = Ctx;
  Offset_local = Offset;
  DebugLineData_local = DebugLineData;
  this_local = this;
  bVar1 = DataExtractor::isValidOffset((DataExtractor *)Offset,(uint64_t)Ctx);
  if (bVar1) {
    LineTable::LineTable(&local_1c8);
    std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>::
    pair<unsigned_long_&,_llvm::DWARFDebugLine::LineTable,_true>
              (&local_120,(unsigned_long *)&Ctx_local,&local_1c8);
    pVar4 = std::
            map<unsigned_long,_llvm::DWARFDebugLine::LineTable,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
            ::insert((map<unsigned_long,_llvm::DWARFDebugLine::LineTable,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
                      *)DebugLineData,&local_120);
    local_70 = pVar4.first._M_node;
    Pos.first._M_node._0_1_ = pVar4.second;
    std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>::~pair(&local_120);
    LineTable::~LineTable(&local_1c8);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>::
             operator->(&local_70);
    OffsetPtr = Offset_local;
    U_00 = U_local;
    RecoverableErrorCallback_00 = local_38;
    DebugLineData_00 = &ppVar2->second;
    Err.Payload = (ErrorInfoBase *)DebugLineData_00;
    if (((byte)Pos.first._M_node & 1) == 0) {
      Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<llvm::DWARFDebugLine::LineTable*>
                ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(LineTable **)&Err,
                 (type *)0x0);
      uVar3 = extraout_RDX_02;
    }
    else {
      std::function<void_(llvm::Error)>::function
                ((function<void_(llvm::Error)> *)local_208,in_stack_00000008);
      LineTable::parse((LineTable *)local_1e8,(DWARFDataExtractor *)DebugLineData_00,
                       (uint64_t *)OffsetPtr,(DWARFContext *)&Ctx_local,U_00,
                       RecoverableErrorCallback_00,(raw_ostream *)local_208);
      std::function<void_(llvm::Error)>::~function((function<void_(llvm::Error)> *)local_208);
      bVar1 = Error::operator_cast_to_bool((Error *)local_1e8);
      if (bVar1) {
        Error::Error(&local_210,(Error *)local_1e8);
        Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
                  ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_210);
        Error::~Error(&local_210);
      }
      Error::~Error((Error *)local_1e8);
      uVar3 = extraout_RDX_00;
      if (!bVar1) {
        Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<llvm::DWARFDebugLine::LineTable*>
                  ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(LineTable **)&Err,
                   (type *)0x0);
        uVar3 = extraout_RDX_01;
      }
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_50,invalid_argument);
    EC._M_cat._0_4_ = local_50._M_value;
    EC._0_8_ = &local_40;
    EC._M_cat._4_4_ = 0;
    createStringError<unsigned_long>
              (EC,(char *)local_50._M_cat,
               (unsigned_long *)"offset 0x%8.8lx is not a valid debug line section offset");
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
              ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_40);
    Error::~Error(&local_40);
    uVar3 = extraout_RDX;
  }
  EVar5._8_8_ = uVar3;
  EVar5.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar5;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFDebugLine::getOrParseLineTable(
    DWARFDataExtractor &DebugLineData, uint64_t Offset, const DWARFContext &Ctx,
    const DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!DebugLineData.isValidOffset(Offset))
    return createStringError(errc::invalid_argument, "offset 0x%8.8" PRIx64
                       " is not a valid debug line section offset",
                       Offset);

  std::pair<LineTableIter, bool> Pos =
      LineTableMap.insert(LineTableMapTy::value_type(Offset, LineTable()));
  LineTable *LT = &Pos.first->second;
  if (Pos.second) {
    if (Error Err =
            LT->parse(DebugLineData, &Offset, Ctx, U, RecoverableErrorCallback))
      return std::move(Err);
    return LT;
  }
  return LT;
}